

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BPlusTree.h
# Opt level: O3

void __thiscall BPlusTree<long>::loose_insert(BPlusTree<long> *this,long *entry)

{
  Array<long> *data;
  int index;
  long *plVar1;
  BPlusTree<long> **ppBVar2;
  long lVar3;
  size_t index_00;
  
  plVar1 = find(this,entry);
  if (plVar1 == (long *)0x0) {
    data = &this->data;
    index = b_array::first_ge<long>(data,this->data_size,entry);
    index_00 = (size_t)index;
    if ((this->subset_size != 0) &&
       (plVar1 = b_array::Array<long>::operator[](data,index_00), *plVar1 != *entry)) {
      ppBVar2 = b_array::Array<BPlusTree<long>_*>::operator[](&this->subset,index_00);
      loose_insert(*ppBVar2,entry);
      ppBVar2 = b_array::Array<BPlusTree<long>_*>::operator[](&this->subset,index_00);
      if ((*ppBVar2)->data_size < 3) {
        return;
      }
      fix_excess(this,index);
      return;
    }
    plVar1 = b_array::Array<long>::operator[](data,index_00);
    if (*plVar1 != *entry) {
      b_array::insert_item<long>(data,index_00,&this->data_size,entry);
      return;
    }
  }
  else {
    lVar3 = *entry;
    if (this->duplicates_allowed == true) {
      lVar3 = lVar3 + *plVar1;
    }
    *plVar1 = lVar3;
  }
  return;
}

Assistant:

void BPlusTree<T>::loose_insert(const T& entry) {
    // check if thing is already here
    T* item = find(entry);
    // assuming the duplicates allowed flag is for multimap to call +=
    if (item != nullptr) {
        if (!duplicates_allowed)
            *item = entry;
        else
            *item += entry;
        return;
    }
    
    // it's not here, put it somewhere
    int index = b_array::first_ge(data, data_size, entry);
    if (!is_leaf() && data[index] != entry)
        subset[index]->loose_insert(entry);
    else {
        if (data[index] != entry)
            b_array::insert_item(data, index, data_size, entry);
        return;
    }
    if (subset[index]->data_size > MAXIMUM) {
        fix_excess(index);
    }
}